

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleTextEdit::scrollToSubstring(QAccessibleTextEdit *this,int startIndex,int endIndex)

{
  IfNotOldStyleArgs<bool,_QMetaMethodArgument> IVar1;
  int line;
  int iVar2;
  int ay;
  QRectF *this_00;
  MoveMode in_EDX;
  MoveMode in_ESI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QTextEdit *edit;
  QRect r;
  QTextCursor cursor;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QRect *in_stack_ffffffffffffff50;
  QRectF *arguments;
  QRect *obj;
  char local_90 [88];
  QRect local_38;
  QPoint local_28;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = in_RDI;
  this_00 = (QRectF *)textEdit((QAccessibleTextEdit *)0x7e3dc7);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)in_RDI + 0x158))(&local_10);
  QTextCursor::setPosition((int)&local_10,in_ESI);
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (undefined1  [16])
             QTextEdit::cursorRect((QTextEdit *)this_00,(QTextCursor *)in_stack_ffffffffffffff50);
  QTextCursor::setPosition((int)&local_10,in_EDX);
  local_38 = QTextEdit::cursorRect((QTextEdit *)this_00,(QTextCursor *)in_stack_ffffffffffffff50);
  local_28 = QRect::bottomRight(in_RDI);
  QRect::setBottomRight
            (in_stack_ffffffffffffff50,
             (QPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  line = QRect::x((QRect *)0x7e3eaf);
  QAbstractScrollArea::horizontalScrollBar
            ((QAbstractScrollArea *)CONCAT44(line,in_stack_ffffffffffffff40));
  iVar2 = QAbstractSlider::value((QAbstractSlider *)CONCAT44(line,in_stack_ffffffffffffff40));
  iVar2 = line + iVar2;
  ay = QRect::y((QRect *)0x7e3ede);
  QAbstractScrollArea::verticalScrollBar
            ((QAbstractScrollArea *)CONCAT44(line,in_stack_ffffffffffffff40));
  QAbstractSlider::value((QAbstractSlider *)CONCAT44(line,in_stack_ffffffffffffff40));
  QRect::moveTo(in_stack_ffffffffffffff50,iVar2,ay);
  arguments = this_00;
  QRectF::QRectF(this_00,(QRect *)CONCAT44(iVar2,ay));
  QtPrivate::Invoke::argument<QRectF>((char *)this_00,(QRectF *)CONCAT44(iVar2,ay));
  IVar1 = QMetaObject::invokeMethod<QMetaMethodArgument>
                    ((QObject *)obj,(char *)CONCAT44(in_ESI,in_EDX),(QMetaMethodArgument *)arguments
                    );
  if (((IVar1 ^ 0xffU) & 1) != 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT44(iVar2,ay),line,(char *)in_RDI);
    QMessageLogger::warning(local_90,"AccessibleTextEdit::scrollToSubstring failed!");
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTextEdit::scrollToSubstring(int startIndex, int endIndex)
{
    QTextEdit *edit = textEdit();

    QTextCursor cursor = textCursor();
    cursor.setPosition(startIndex);
    QRect r = edit->cursorRect(cursor);

    cursor.setPosition(endIndex);
    r.setBottomRight(edit->cursorRect(cursor).bottomRight());

    r.moveTo(r.x() + edit->horizontalScrollBar()->value(),
             r.y() + edit->verticalScrollBar()->value());

    // E V I L, but ensureVisible is not public
    if (Q_UNLIKELY(!QMetaObject::invokeMethod(edit, "_q_ensureVisible", Q_ARG(QRectF, r))))
        qWarning("AccessibleTextEdit::scrollToSubstring failed!");
}